

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Utf8CharLen(char *zIn,int nByte)

{
  byte bVar1;
  u8 *puVar2;
  u8 *local_28;
  u8 *zTerm;
  u8 *z;
  int r;
  int nByte_local;
  char *zIn_local;
  
  z._0_4_ = 0;
  zTerm = (u8 *)zIn;
  if (nByte < 0) {
    local_28 = (u8 *)0xffffffffffffffff;
  }
  else {
    local_28 = (u8 *)(zIn + nByte);
  }
  while (*zTerm != '\0' && zTerm < local_28) {
    puVar2 = zTerm + 1;
    bVar1 = *zTerm;
    zTerm = puVar2;
    if (0xbf < bVar1) {
      for (; (*zTerm & 0xc0) == 0x80; zTerm = zTerm + 1) {
      }
    }
    z._0_4_ = (int)z + 1;
  }
  return (int)z;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8CharLen(const char *zIn, int nByte){
  int r = 0;
  const u8 *z = (const u8*)zIn;
  const u8 *zTerm;
  if( nByte>=0 ){
    zTerm = &z[nByte];
  }else{
    zTerm = (const u8*)(-1);
  }
  assert( z<=zTerm );
  while( *z!=0 && z<zTerm ){
    SQLITE_SKIP_UTF8(z);
    r++;
  }
  return r;
}